

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O0

Function * __thiscall spvtools::opt::IRContext::GetFunction(IRContext *this,uint32_t id)

{
  bool bVar1;
  pointer ppVar2;
  Function *local_38;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_false> local_28;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_false> local_20;
  iterator entry;
  uint32_t id_local;
  IRContext *this_local;
  
  entry.super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_false>.
  _M_cur._4_4_ = id;
  bVar1 = AreAnalysesValid(this,kAnalysisIdToFuncMapping);
  if (!bVar1) {
    BuildIdToFuncMapping(this);
  }
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_spvtools::opt::Function_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>_>
       ::find(&this->id_to_func_,
              (key_type *)
              ((long)&entry.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_false>
                      ._M_cur + 4));
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_spvtools::opt::Function_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>_>
       ::end(&this->id_to_func_);
  bVar1 = std::__detail::operator!=(&local_20,&local_28);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_false,_false>
                           *)&local_20);
    local_38 = ppVar2->second;
  }
  else {
    local_38 = (Function *)0x0;
  }
  return local_38;
}

Assistant:

Function* GetFunction(uint32_t id) {
    if (!AreAnalysesValid(kAnalysisIdToFuncMapping)) {
      BuildIdToFuncMapping();
    }
    auto entry = id_to_func_.find(id);
    return (entry != id_to_func_.end()) ? entry->second : nullptr;
  }